

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrototypeChainCache.cpp
# Opt level: O0

bool __thiscall
Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>::Check
          (PrototypeChainCache<Js::OnlyWritablePropertyCache> *this,RecyclableObject *object)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  TypeId TVar4;
  undefined4 *puVar5;
  Type *this_00;
  RecyclableObject *prototype;
  TypeId typeId;
  RecyclableObject *object_local;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *this_local;
  
  if (object == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/PrototypeChainCache.cpp"
                                ,0x98,"(object)","object");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  this_00 = RecyclableObject::GetType(object);
  BVar3 = Js::Type::HasSpecialPrototype(this_00);
  if (BVar3 != 0) {
    TVar4 = RecyclableObject::GetTypeId(object);
    if (TVar4 == TypeIds_Null) {
      return true;
    }
    if (TVar4 == TypeIds_Proxy) {
      return false;
    }
  }
  bVar2 = OnlyWritablePropertyCache::CheckObject(object);
  if (bVar2) {
    prototype = RecyclableObject::GetPrototype(object);
    this_local._7_1_ = CheckProtoChain(this,prototype);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
PrototypeChainCache<T>::Check(_In_ RecyclableObject* object)
{
    Assert(object);
    if (object->GetType()->HasSpecialPrototype())
    {
        TypeId typeId = object->GetTypeId();
        if (typeId == TypeIds_Null)
        {
            return true;
        }
        if (typeId == TypeIds_Proxy)
        {
            return false;
        }
    }

    if (!T::CheckObject(object))
    {
        return false;
    }

    return CheckProtoChain(object->GetPrototype());
}